

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sighash_tests.cpp
# Opt level: O3

void __thiscall
SigHashTest::RandomTransaction(SigHashTest *this,CMutableTransaction *tx,bool fSingle)

{
  FastRandomContext *this_00;
  pointer pCVar1;
  pointer pCVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  long in_FS_OFFSET;
  bool bVar7;
  Span<std::byte> output;
  uint256 ret;
  uint local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = &(this->super_BasicTestingSetup).m_rng;
  uVar4 = RandomMixin<FastRandomContext>::randbits<32>
                    (&this_00->super_RandomMixin<FastRandomContext>);
  tx->version = (uint32_t)uVar4;
  std::vector<CTxIn,_std::allocator<CTxIn>_>::_M_erase_at_end
            (&tx->vin,(tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::_M_erase_at_end
            (&tx->vout,
             (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
             super__Vector_impl_data._M_start);
  uVar4 = RandomMixin<FastRandomContext>::randbits<1>
                    (&this_00->super_RandomMixin<FastRandomContext>);
  if (uVar4 == 0) {
    uVar3 = 0;
  }
  else {
    uVar4 = RandomMixin<FastRandomContext>::randbits<32>
                      (&this_00->super_RandomMixin<FastRandomContext>);
    uVar3 = (uint32_t)uVar4;
  }
  tx->nLockTime = uVar3;
  uVar4 = RandomMixin<FastRandomContext>::randbits(&this_00->super_RandomMixin<FastRandomContext>,2)
  ;
  uVar6 = (uint)uVar4;
  local_68 = uVar6;
  if (!fSingle) {
    uVar4 = RandomMixin<FastRandomContext>::randbits
                      (&this_00->super_RandomMixin<FastRandomContext>,2);
    local_68 = (uint)uVar4;
  }
  if (uVar6 < 0x7fffffff) {
    iVar5 = uVar6 + 1;
    do {
      std::vector<CTxIn,_std::allocator<CTxIn>_>::emplace_back<>(&tx->vin);
      pCVar1 = (tx->vin).super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_48 = 0;
      uStack_40 = 0;
      local_58 = 0;
      uStack_50 = 0;
      output.m_size = 0x20;
      output.m_data = (byte *)&local_58;
      FastRandomContext::fillrand(this_00,output);
      *(undefined8 *)
       (pCVar1[-1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x10) = local_48;
      *(undefined8 *)
       (pCVar1[-1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 0x18) = uStack_40;
      *(undefined8 *)pCVar1[-1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems =
           local_58;
      *(undefined8 *)(pCVar1[-1].prevout.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems + 8) =
           uStack_50;
      uVar4 = RandomMixin<FastRandomContext>::randbits
                        (&this_00->super_RandomMixin<FastRandomContext>,2);
      pCVar1[-1].prevout.n = (uint32_t)uVar4;
      RandomScript(this,&pCVar1[-1].scriptSig);
      uVar4 = RandomMixin<FastRandomContext>::randbits<1>
                        (&this_00->super_RandomMixin<FastRandomContext>);
      if (uVar4 == 0) {
        uVar3 = 0xffffffff;
      }
      else {
        uVar4 = RandomMixin<FastRandomContext>::randbits<32>
                          (&this_00->super_RandomMixin<FastRandomContext>);
        uVar3 = (uint32_t)uVar4;
      }
      pCVar1[-1].nSequence = uVar3;
      iVar5 = iVar5 + -1;
    } while (iVar5 != 0);
  }
  if (local_68 < 0x7fffffff) {
    uVar6 = 0;
    do {
      std::vector<CTxOut,_std::allocator<CTxOut>_>::emplace_back<>(&tx->vout);
      pCVar2 = (tx->vout).super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_finish;
      do {
        uVar4 = RandomMixin<FastRandomContext>::randbits
                          (&this_00->super_RandomMixin<FastRandomContext>,0x33);
      } while (2100000000000000 < uVar4);
      pCVar2[-1].nValue = uVar4;
      RandomScript(this,&pCVar2[-1].scriptPubKey);
      bVar7 = uVar6 != local_68;
      uVar6 = uVar6 + 1;
    } while (bVar7);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void RandomTransaction(CMutableTransaction& tx, bool fSingle)
{
    tx.version = m_rng.rand32();
    tx.vin.clear();
    tx.vout.clear();
    tx.nLockTime = (m_rng.randbool()) ? m_rng.rand32() : 0;
    int ins = (m_rng.randbits(2)) + 1;
    int outs = fSingle ? ins : (m_rng.randbits(2)) + 1;
    for (int in = 0; in < ins; in++) {
        tx.vin.emplace_back();
        CTxIn &txin = tx.vin.back();
        txin.prevout.hash = Txid::FromUint256(m_rng.rand256());
        txin.prevout.n = m_rng.randbits(2);
        RandomScript(txin.scriptSig);
        txin.nSequence = (m_rng.randbool()) ? m_rng.rand32() : std::numeric_limits<uint32_t>::max();
    }
    for (int out = 0; out < outs; out++) {
        tx.vout.emplace_back();
        CTxOut &txout = tx.vout.back();
        txout.nValue = RandMoney(m_rng);
        RandomScript(txout.scriptPubKey);
    }
}